

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schedule.hpp
# Opt level: O0

TaskHandle __thiscall
Task::dealloc(Task *this,
             vector<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_> *operands)

{
  bool bVar1;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  TaskHandle TVar3;
  value_type local_b8;
  shared_ptr<Operand> *local_50;
  shared_ptr<Operand> *operand;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_> *__range1;
  vector<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_> *operands_local;
  shared_ptr<Task> *task;
  
  std::make_shared<Task>();
  peVar2 = std::__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this);
  std::__cxx11::string::operator=((string *)&peVar2->name,".dealloc");
  __end1 = std::vector<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_>::begin
                     (operands);
  operand = (shared_ptr<Operand> *)
            std::vector<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_>::end
                      (operands);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::shared_ptr<Operand>_*,_std::vector<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_>_>
                                     *)&operand), bVar1) {
    local_50 = __gnu_cxx::
               __normal_iterator<const_std::shared_ptr<Operand>_*,_std::vector<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_>_>
               ::operator*(&__end1);
    peVar2 = std::__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this)
    ;
    std::shared_ptr<Operand>::shared_ptr(&local_b8.operand,local_50);
    local_b8.version = 0;
    std::shared_ptr<Task>::shared_ptr(&local_b8.gen);
    std::shared_ptr<Task>::shared_ptr(&local_b8.next_gen);
    std::shared_ptr<Task>::shared_ptr(&local_b8.prev_use);
    std::shared_ptr<Task>::shared_ptr(&local_b8.next_use);
    std::shared_ptr<Task>::shared_ptr(&local_b8.last_use);
    std::vector<OperandUsage,_std::allocator<OperandUsage>_>::push_back(&peVar2->outs,&local_b8);
    OperandUsage::~OperandUsage(&local_b8);
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<Operand>_*,_std::vector<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_>_>
    ::operator++(&__end1);
  }
  TVar3.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi;
  TVar3.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (TaskHandle)TVar3.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static TaskHandle dealloc(const std::vector<OperandHandle> &operands) {
        auto task = std::make_shared<Task>();
        task->name = ".dealloc";
        for (auto &operand: operands) {
            task->outs.push_back(OperandUsage{ operand });
        }
        return task;
    }